

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_Book.cpp
# Opt level: O1

void __thiscall bookClass::buy(bookClass *this,string *ISBN,int num)

{
  pointer pcVar1;
  int num_00;
  vector<int,_std::allocator<int>_> index;
  fstream file;
  vector<int,_std::allocator<int>_> local_270;
  double local_258;
  string local_250;
  char local_230 [16];
  char local_220 [512];
  
  pcVar1 = (ISBN->_M_dataplus)._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar1,pcVar1 + ISBN->_M_string_length);
  unrolledLinkedListClass::readIndexData(&local_270,&Isbn,&local_250,'1');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((long)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 4) {
    read_file(this,*local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    num_00 = this->num - num;
    if (num <= this->num) {
      this->num = num_00;
      dataClass::changeBookData
                ((dataClass *)&data_manager,num_00,
                 *local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
      local_258 = (double)num;
      income = income + this->price * local_258;
      printf("%.2lf\n");
      std::fstream::fstream(local_230);
      std::fstream::open(local_230,0x1100e5);
      std::ostream::seekp(local_220,0x10,0);
      std::ostream::write(local_220,0x115390);
      std::fstream::close();
      dataClass::recordFinance((dataClass *)&data_manager,false,local_258 * this->price);
      std::fstream::~fstream(local_230);
      goto LAB_0010785d;
    }
  }
  success = '0';
  puts("Invalid");
LAB_0010785d:
  if (local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void bookClass::buy(string ISBN, int num) {
	vector<int> index = Isbn.readIndexData(ISBN, '1');
	if (index.size() != 1) {ERROR; return ;}
	this->read_file(index[0]);
	if (this->num >= num) {
		this->num -= num;
		data_manager.changeBookData(this->num, index[0]);
		income += num * price;
		printf("%.2lf\n", num * price);
		fstream file;
		file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
		file.seekp(16);
		file.write(reinterpret_cast<char *> (&income), 8);
		file.close();
		data_manager.recordFinance(0, num * price);
	} else ERROR;
}